

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O1

void __thiscall
duckdb::ByteStreamSplitDecoder::Read
          (ByteStreamSplitDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  type tVar1;
  ColumnReader *pCVar2;
  Allocator *allocator;
  ResizeableBuffer *this_00;
  pointer pBVar3;
  runtime_error *this_01;
  idx_t iVar4;
  idx_t iVar5;
  
  pCVar2 = this->reader;
  iVar4 = read_count;
  if (defines != (uint8_t *)0x0) {
    if (result_offset < result_offset + read_count) {
      iVar5 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (pCVar2->column_schema->max_define == (ulong)defines[iVar5 + result_offset])
        ;
        iVar5 = iVar5 + 1;
      } while (read_count != iVar5);
    }
    else {
      iVar4 = 0;
    }
  }
  allocator = pCVar2->reader->allocator;
  this_00 = this->decoded_data_buffer;
  iVar5 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = (this_00->allocated_data).pointer;
  (this_00->super_ByteBuffer).len = iVar5;
  tVar1 = pCVar2->column_schema->parquet_type;
  if (tVar1 == DOUBLE) {
    ResizeableBuffer::resize(this_00,allocator,iVar4 * 8);
    pBVar3 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::GetBatch<double>
              (pBVar3,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)iVar4);
  }
  else {
    if (tVar1 != FLOAT) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_01,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
      __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize(this_00,allocator,iVar4 * 4);
    pBVar3 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::GetBatch<float>
              (pBVar3,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)iVar4);
  }
  (*this->reader->_vptr_ColumnReader[0xe])
            (this->reader,this->decoded_data_buffer,defines,read_count,result_offset,result);
  return;
}

Assistant:

void ByteStreamSplitDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		decoded_data_buffer.resize(allocator, sizeof(float) * valid_count);
		bss_decoder->GetBatch<float>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		decoded_data_buffer.resize(allocator, sizeof(double) * valid_count);
		bss_decoder->GetBatch<double>(decoded_data_buffer.ptr, valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}

	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}